

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter1,GetterXsYRef<unsigned_long_long> *getter2,
               TransformerLinLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  unsigned_long_long uVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  int local_84;
  ImDrawList *local_80;
  undefined1 local_78 [16];
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_long_long> *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_80 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_84 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_84 = getter1->Count;
    }
    if (0 < local_84) {
      iVar12 = 0;
      do {
        pIVar9 = GImPlot;
        iVar4 = getter1->Count;
        lVar11 = (long)(((getter1->Offset + iVar12) % iVar4 + iVar4) % iVar4) *
                 (long)getter1->Stride;
        uVar3 = *(unsigned_long_long *)((long)getter1->Xs + lVar11);
        dVar8 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
        local_78._8_4_ = SUB84(dVar8,0);
        local_78._0_8_ = dVar8 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        local_78._12_4_ = (int)((ulong)dVar8 >> 0x20);
        uVar3 = *(unsigned_long_long *)((long)getter1->Ys + lVar11);
        dVar7 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar10 = GImPlot;
        iVar4 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar8 = pIVar6->YAxis[iVar4].Range.Min;
        local_58._4_4_ =
             (float)((((double)(float)(dVar7 / pIVar9->LogDenY[iVar4]) *
                       (pIVar6->YAxis[iVar4].Range.Max - dVar8) + dVar8) - dVar8) *
                     pIVar9->My[iVar4] + (double)pIVar9->PixelRange[iVar4].Min.y);
        local_58._0_4_ =
             (float)(((double)local_78._0_8_ - (pIVar6->XAxis).Range.Min) * pIVar9->Mx +
                    (double)pIVar9->PixelRange[iVar4].Min.x);
        iVar5 = getter2->Count;
        uVar3 = *(unsigned_long_long *)
                 ((long)getter2->Xs +
                 (long)(((getter2->Offset + iVar12) % iVar5 + iVar5) % iVar5) *
                 (long)getter2->Stride);
        dVar8 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
        local_78._8_4_ = SUB84(dVar8,0);
        local_78._0_8_ = dVar8 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        local_78._12_4_ = (int)((ulong)dVar8 >> 0x20);
        dVar7 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar4].Range.Min);
        iVar4 = transformer->YAxis;
        pIVar6 = pIVar10->CurrentPlot;
        dVar8 = pIVar6->YAxis[iVar4].Range.Min;
        fVar14 = (float)(((double)local_78._0_8_ - (pIVar6->XAxis).Range.Min) * pIVar10->Mx +
                        (double)pIVar10->PixelRange[iVar4].Min.x);
        fVar13 = (float)((((double)(float)(dVar7 / pIVar10->LogDenY[iVar4]) *
                           (pIVar6->YAxis[iVar4].Range.Max - dVar8) + dVar8) - dVar8) *
                         pIVar10->My[iVar4] + (double)pIVar10->PixelRange[iVar4].Min.y);
        local_90.y = fVar13;
        local_90.x = fVar14;
        pIVar6 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar2 = fVar13;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           local_58._4_4_ & -(uint)(fVar13 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar14 <= (float)local_58._0_4_) {
            fVar2 = fVar14;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar14 <= (float)local_58._0_4_) & (uint)fVar14 |
                             local_58._0_4_ & -(uint)(fVar14 <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_80,(ImVec2 *)local_58,&local_90,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
      } while (local_84 != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}